

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

bool __thiscall
despot::POMDPX::Step
          (POMDPX *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  bool bVar1;
  OBS_TYPE OVar2;
  double dVar3;
  POMDPXState *state;
  OBS_TYPE *obs_local;
  double *reward_local;
  double dStack_20;
  ACT_TYPE action_local;
  double random_num_local;
  State *s_local;
  POMDPX *this_local;
  
  dStack_20 = random_num;
  random_num_local = (double)s;
  s_local = (State *)this;
  Parser::GetNextState
            (this->parser_,(vector<int,_std::allocator<int>_> *)(s + 1),action,
             &stack0xffffffffffffffe0);
  dVar3 = Parser::GetReward(this->parser_,action);
  *reward = dVar3;
  OVar2 = Parser::GetObservation
                    (this->parser_,(vector<int,_std::allocator<int>_> *)(s + 1),action,
                     &stack0xffffffffffffffe0);
  *obs = OVar2;
  bVar1 = Parser::IsTerminalState(this->parser_,(vector<int,_std::allocator<int>_> *)(s + 1));
  return bVar1;
}

Assistant:

bool POMDPX::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	POMDPXState& state = static_cast<POMDPXState&>(s);

	parser_->GetNextState(state.vec_id, action, random_num);
	reward = parser_->GetReward(action); // Prev state and curr state set in GetNextState
	obs = parser_->GetObservation(state.vec_id, action, random_num);

	return parser_->IsTerminalState(state.vec_id);
}